

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeglintegration.cpp
# Opt level: O0

xcb_visualid_t __thiscall
QXcbEglIntegration::getCompatibleVisualId
          (QXcbEglIntegration *this,xcb_screen_t *screen,EGLConfig config)

{
  uint uVar1;
  xcb_visualid_t xVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  EGLDisplay pvVar8;
  ulong uVar9;
  VisualInfo *pVVar10;
  undefined8 in_RDX;
  char *pcVar11;
  _Optional_payload_base<unsigned_int> in_RDI;
  long in_FS_OFFSET;
  bool visualMatchesConfig;
  int visualAlphaSize;
  int visualBlueSize;
  int visualGreenSize;
  int visualRedSize;
  char *vendor;
  int configId;
  uint8_t depth;
  EGLint configAlphaSize;
  EGLint configBlueSize;
  EGLint configGreenSize;
  EGLint configRedSize;
  EGLint eglValue;
  xcb_visualid_t visualId;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_4;
  optional<(anonymous_namespace)::VisualInfo> matchingVisual;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  optional<(anonymous_namespace)::VisualInfo> chosenVisualInfo;
  int in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  uint in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  uint in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  int in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  int in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  _Optional_payload_base<unsigned_char> in_stack_fffffffffffffdba;
  xcb_visualid_t local_1dc;
  char local_1d8 [32];
  char local_1b8 [39];
  char local_191;
  char local_190 [32];
  char local_170 [32];
  char local_150 [32];
  char local_130 [38];
  optional<unsigned_char> local_10a;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  uint local_f8;
  xcb_visualid_t local_f4;
  undefined8 local_f0;
  ulong local_e8;
  optional<unsigned_int> local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  optional<unsigned_int> local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  ulong local_88;
  undefined8 local_80;
  ulong local_78;
  undefined8 local_70;
  ulong local_68;
  undefined8 local_60;
  ulong local_58;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_f4 = 0;
  local_f8 = 0;
  local_fc = 0;
  pvVar8 = eglDisplay((QXcbEglIntegration *)in_RDI);
  eglGetConfigAttrib(pvVar8,in_RDX,0x3024,&local_fc);
  local_100 = 0;
  pvVar8 = eglDisplay((QXcbEglIntegration *)in_RDI);
  eglGetConfigAttrib(pvVar8,in_RDX,0x3023,&local_100);
  local_104 = 0;
  pvVar8 = eglDisplay((QXcbEglIntegration *)in_RDI);
  eglGetConfigAttrib(pvVar8,in_RDX,0x3022,&local_104);
  local_108 = 0;
  pvVar8 = eglDisplay((QXcbEglIntegration *)in_RDI);
  eglGetConfigAttrib(pvVar8,in_RDX,0x3021,&local_108);
  pvVar8 = eglDisplay((QXcbEglIntegration *)in_RDI);
  eglGetConfigAttrib(pvVar8,in_RDX,0x3028,&local_f8);
  uVar1 = local_f8;
  pvVar8 = eglDisplay((QXcbEglIntegration *)in_RDI);
  eglGetConfigAttrib(pvVar8,in_RDX,0x302e,&local_f8);
  local_f4 = local_f8;
  if (local_f8 == 0) {
    local_80 = 0xaaaaaaaaaaaaaaaa;
    local_78 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcQpaGl();
    anon_unknown.dwarf_1252d::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_80), bVar3) {
      anon_unknown.dwarf_1252d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x108cbe);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                 in_stack_fffffffffffffd74,
                 (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                 (char *)0x108cd7);
      QMessageLogger::debug
                (local_170,
                 "EGL did not suggest a VisualID (EGL_NATIVE_VISUAL_ID was zero) for EGLConfig %d",
                 (ulong)uVar1);
      local_78 = local_78 & 0xffffffffffffff00;
    }
  }
  else {
    local_48 = 0xaaaaaaaaaaaaaaaa;
    local_40 = 0xaaaaaaaaaaaaaaaa;
    local_38 = 0xaaaaaaaaaaaaaaaa;
    local_30 = 0xaaaaaaaaaaaaaaaa;
    std::optional<unsigned_int>::optional<unsigned_int_&,_true>
              ((optional<unsigned_int> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (uint *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    std::optional<unsigned_char>::optional(&local_10a);
    anon_unknown.dwarf_1252d::getVisualInfo
              ((xcb_screen_t *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               (optional<unsigned_int>)in_RDI,(optional<unsigned_char>)in_stack_fffffffffffffdba);
    bVar3 = std::optional::operator_cast_to_bool
                      ((optional<(anonymous_namespace)::VisualInfo> *)0x108902);
    if (bVar3) {
      pvVar8 = eglDisplay((QXcbEglIntegration *)in_RDI);
      uVar9 = q_hasEglExtension(pvVar8,"EGL_NV_post_convert_rounding");
      if ((uVar9 & 1) != 0) {
        local_1dc = local_f4;
        goto LAB_00109071;
      }
      pvVar8 = eglDisplay((QXcbEglIntegration *)in_RDI);
      pcVar11 = (char *)eglQueryString(pvVar8,0x3053);
      if ((pcVar11 != (char *)0x0) && (pcVar11 = strstr(pcVar11,"Vivante"), pcVar11 != (char *)0x0))
      {
        local_1dc = local_f4;
        goto LAB_00109071;
      }
      pVVar10 = std::optional<(anonymous_namespace)::VisualInfo>::operator->
                          ((optional<(anonymous_namespace)::VisualInfo> *)0x1089a1);
      uVar4 = qPopulationCount((pVVar10->visualType).red_mask);
      pVVar10 = std::optional<(anonymous_namespace)::VisualInfo>::operator->
                          ((optional<(anonymous_namespace)::VisualInfo> *)0x1089bd);
      uVar5 = qPopulationCount((pVVar10->visualType).green_mask);
      pVVar10 = std::optional<(anonymous_namespace)::VisualInfo>::operator->
                          ((optional<(anonymous_namespace)::VisualInfo> *)0x1089d9);
      uVar6 = qPopulationCount((pVVar10->visualType).blue_mask);
      pVVar10 = std::optional<(anonymous_namespace)::VisualInfo>::operator->
                          ((optional<(anonymous_namespace)::VisualInfo> *)0x1089f5);
      iVar7 = ((pVVar10->depth - uVar4) - uVar6) - uVar5;
      bVar3 = false;
      if (((local_fc <= (int)uVar4) && (bVar3 = false, local_100 <= (int)uVar5)) &&
         (bVar3 = false, local_104 <= (int)uVar6)) {
        bVar3 = local_108 <= iVar7;
      }
      if (!bVar3) {
        local_f4 = 0;
        local_60 = 0xaaaaaaaaaaaaaaaa;
        local_58 = 0xaaaaaaaaaaaaaaaa;
        QtPrivateLogging::lcQpaGl();
        anon_unknown.dwarf_1252d::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                   CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68)
                  );
        while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_60), bVar3) {
          anon_unknown.dwarf_1252d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x108ae2);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
                     ,(char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                     in_stack_fffffffffffffd74,
                     (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                     (char *)0x108afb);
          xVar2 = local_f4;
          pVVar10 = std::optional<(anonymous_namespace)::VisualInfo>::operator->
                              ((optional<(anonymous_namespace)::VisualInfo> *)0x108b3c);
          in_stack_fffffffffffffd70 = (uint)pVVar10->depth;
          in_stack_fffffffffffffd68 = iVar7;
          in_stack_fffffffffffffd78 = uVar1;
          in_stack_fffffffffffffd80 = local_fc;
          in_stack_fffffffffffffd90 = local_104;
          QMessageLogger::debug
                    (local_130,
                     "EGL suggested using X Visual ID %d (%d %d %d %d depth %d) for EGL config %d(%d %d %d %d), but this is incompatible"
                     ,(ulong)xVar2,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
          local_58 = local_58 & 0xffffffffffffff00;
        }
      }
    }
    else {
      local_70 = 0xaaaaaaaaaaaaaaaa;
      local_68 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcQpaGl();
      anon_unknown.dwarf_1252d::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_70), bVar3) {
        anon_unknown.dwarf_1252d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x108c14);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                   (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   in_stack_fffffffffffffd74,
                   (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   (char *)0x108c2d);
        QMessageLogger::debug
                  (local_150,
                   "EGL suggested using X Visual ID %d for EGL config %d, but that isn\'t a valid ID"
                   ,(ulong)local_f4,(ulong)uVar1);
        local_68 = local_68 & 0xffffffffffffff00;
      }
      local_f4 = 0;
    }
  }
  if (local_f4 == 0) {
    local_191 = (char)local_fc + (char)local_100 + (char)local_104 + (char)local_108;
    local_b0 = 0xaaaaaaaaaaaaaaaa;
    local_a8 = 0xaaaaaaaaaaaaaaaa;
    local_a0 = 0xaaaaaaaaaaaaaaaa;
    local_98 = 0xaaaaaaaaaaaaaaaa;
    std::optional<unsigned_int>::optional(&local_b8);
    std::optional<unsigned_char>::optional<unsigned_char_&,_true>
              ((optional<unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (uchar *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    anon_unknown.dwarf_1252d::getVisualInfo
              ((xcb_screen_t *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               (optional<unsigned_int>)in_RDI,(optional<unsigned_char>)in_stack_fffffffffffffdba);
    bVar3 = std::optional::operator_cast_to_bool
                      ((optional<(anonymous_namespace)::VisualInfo> *)0x108e9b);
    if (!bVar3) {
      local_191 = (char)local_fc + (char)local_100 + (char)local_104;
      std::optional<unsigned_int>::optional(&local_e0);
      std::optional<unsigned_char>::optional<unsigned_char_&,_true>
                ((optional<unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                 (uchar *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      anon_unknown.dwarf_1252d::getVisualInfo
                ((xcb_screen_t *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (optional<unsigned_int>)in_RDI,(optional<unsigned_char>)in_stack_fffffffffffffdba);
      local_b0 = local_d8;
      local_a8 = local_d0;
      local_a0 = local_c8;
      local_98 = local_c0;
    }
    bVar3 = std::optional::operator_cast_to_bool
                      ((optional<(anonymous_namespace)::VisualInfo> *)0x108f5d);
    if (bVar3) {
      pVVar10 = std::optional<(anonymous_namespace)::VisualInfo>::operator->
                          ((optional<(anonymous_namespace)::VisualInfo> *)0x108f70);
      local_f4 = (pVVar10->visualType).visual_id;
    }
    if (local_f4 == 0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                 in_stack_fffffffffffffd74,
                 (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      QMessageLogger::warning
                (local_1d8,"Unable to find an X11 visual which matches EGL config %d",(ulong)uVar1);
      local_1dc = 0;
    }
    else {
      local_f0 = 0xaaaaaaaaaaaaaaaa;
      local_e8 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcQpaGl();
      anon_unknown.dwarf_1252d::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_f0), bVar3) {
        anon_unknown.dwarf_1252d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x108fdc);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                   (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   in_stack_fffffffffffffd74,
                   (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   (char *)0x108ff5);
        QMessageLogger::debug
                  (local_1b8,"Using Visual ID %d provided by getVisualInfo for EGL config %d",
                   (ulong)local_f4,(ulong)uVar1);
        local_e8 = local_e8 & 0xffffffffffffff00;
      }
      local_1dc = local_f4;
    }
  }
  else {
    local_90 = 0xaaaaaaaaaaaaaaaa;
    local_88 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcQpaGl();
    anon_unknown.dwarf_1252d::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_90), bVar3) {
      anon_unknown.dwarf_1252d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x108d61);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                 in_stack_fffffffffffffd74,
                 (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                 (char *)0x108d7a);
      pcVar11 = "Using Opaque Visual ID %d provided by EGL for config %d";
      if (0 < local_108) {
        pcVar11 = "Using ARGB Visual ID %d provided by EGL for config %d";
      }
      QMessageLogger::debug(local_190,pcVar11,(ulong)local_f4,(ulong)uVar1);
      local_88 = local_88 & 0xffffffffffffff00;
    }
    local_1dc = local_f4;
  }
LAB_00109071:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return local_1dc;
  }
  __stack_chk_fail();
}

Assistant:

xcb_visualid_t QXcbEglIntegration::getCompatibleVisualId(xcb_screen_t *screen, EGLConfig config) const
{
    xcb_visualid_t visualId = 0;
    EGLint eglValue = 0;

    EGLint configRedSize = 0;
    eglGetConfigAttrib(eglDisplay(), config, EGL_RED_SIZE, &configRedSize);

    EGLint configGreenSize = 0;
    eglGetConfigAttrib(eglDisplay(), config, EGL_GREEN_SIZE, &configGreenSize);

    EGLint configBlueSize = 0;
    eglGetConfigAttrib(eglDisplay(), config, EGL_BLUE_SIZE, &configBlueSize);

    EGLint configAlphaSize = 0;
    eglGetConfigAttrib(eglDisplay(), config, EGL_ALPHA_SIZE, &configAlphaSize);

    eglGetConfigAttrib(eglDisplay(), config, EGL_CONFIG_ID, &eglValue);
    int configId = eglValue;

    // See if EGL provided a valid VisualID:
    eglGetConfigAttrib(eglDisplay(), config, EGL_NATIVE_VISUAL_ID, &eglValue);
    visualId = eglValue;
    if (visualId) {
        // EGL has suggested a visual id, so get the rest of the visual info for that id:
        std::optional<VisualInfo> chosenVisualInfo = getVisualInfo(screen, visualId);
        if (chosenVisualInfo) {
            // Skip size checks if implementation supports non-matching visual
            // and config (QTBUG-9444).
            if (q_hasEglExtension(eglDisplay(), "EGL_NV_post_convert_rounding"))
                return visualId;
            // Skip also for i.MX6 where 565 visuals are suggested for the default 444 configs and it works just fine.
            const char *vendor = eglQueryString(eglDisplay(), EGL_VENDOR);
            if (vendor && strstr(vendor, "Vivante"))
                return visualId;

            int visualRedSize = qPopulationCount(chosenVisualInfo->visualType.red_mask);
            int visualGreenSize = qPopulationCount(chosenVisualInfo->visualType.green_mask);
            int visualBlueSize = qPopulationCount(chosenVisualInfo->visualType.blue_mask);
            int visualAlphaSize = chosenVisualInfo->depth - visualRedSize - visualBlueSize - visualGreenSize;

            const bool visualMatchesConfig = visualRedSize >= configRedSize
                && visualGreenSize >= configGreenSize
                && visualBlueSize >= configBlueSize
                && visualAlphaSize >= configAlphaSize;

            // In some cases EGL tends to suggest a 24-bit visual for 8888
            // configs. In such a case we have to fall back to getVisualInfo.
            if (!visualMatchesConfig) {
                visualId = 0;
                qCDebug(lcQpaGl,
                        "EGL suggested using X Visual ID %d (%d %d %d %d depth %d) for EGL config %d"
                        "(%d %d %d %d), but this is incompatible",
                        visualId, visualRedSize, visualGreenSize, visualBlueSize, visualAlphaSize, chosenVisualInfo->depth,
                        configId, configRedSize, configGreenSize, configBlueSize, configAlphaSize);
            }
        } else {
            qCDebug(lcQpaGl, "EGL suggested using X Visual ID %d for EGL config %d, but that isn't a valid ID",
                    visualId, configId);
            visualId = 0;
        }
    }
    else
        qCDebug(lcQpaGl, "EGL did not suggest a VisualID (EGL_NATIVE_VISUAL_ID was zero) for EGLConfig %d", configId);

    if (visualId) {
        qCDebug(lcQpaGl, configAlphaSize > 0
                ? "Using ARGB Visual ID %d provided by EGL for config %d"
                : "Using Opaque Visual ID %d provided by EGL for config %d", visualId, configId);
        return visualId;
    }

    // Finally, try to use getVisualInfo and only use the bit depths to match on:
    if (!visualId) {
        uint8_t depth = configRedSize + configGreenSize + configBlueSize + configAlphaSize;
        std::optional<VisualInfo> matchingVisual = getVisualInfo(screen, std::nullopt, depth);
        if (!matchingVisual) {
            // Try again without taking the alpha channel into account:
            depth = configRedSize + configGreenSize + configBlueSize;
            matchingVisual = getVisualInfo(screen, std::nullopt, depth);
        }

        if (matchingVisual)
            visualId = matchingVisual->visualType.visual_id;
    }

    if (visualId) {
        qCDebug(lcQpaGl, "Using Visual ID %d provided by getVisualInfo for EGL config %d", visualId, configId);
        return visualId;
    }

    qWarning("Unable to find an X11 visual which matches EGL config %d", configId);
    return 0;
}